

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * __thiscall kj::Path::eval(Path *__return_storage_ptr__,Path *this,StringPtr pathText)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  String *pSVar4;
  String *params;
  Vector<kj::String> *this_00;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t in_R8;
  StringPtr path;
  StringPtr path_00;
  StringPtr path_01;
  StringPtr path_02;
  String *p;
  String *__end2;
  String *__begin2;
  Array<kj::String> *__range2;
  undefined1 local_a8 [8];
  Vector<kj::String> newParts;
  Vector<kj::String> local_58;
  StringPtr local_38;
  Path *local_28;
  Path *this_local;
  StringPtr pathText_local;
  
  pathText_local.content.ptr = (char *)pathText.content.size_;
  this_local = (Path *)pathText.content.ptr;
  local_28 = this;
  pathText_local.content.size_ = (size_t)__return_storage_ptr__;
  StringPtr::StringPtr(&local_38,"/");
  bVar1 = StringPtr::startsWith((StringPtr *)&this_local,&local_38);
  if (bVar1) {
    path.content.size_ = extraout_RDX;
    path.content.ptr = pathText_local.content.ptr;
    sVar2 = countParts(this_local,path);
    Vector<kj::String>::Vector(&local_58,sVar2);
    path_01.content.size_ = in_R8;
    path_01.content.ptr = pathText_local.content.ptr;
    evalImpl(__return_storage_ptr__,(Path *)&local_58,(Vector<kj::String> *)this_local,path_01);
    Vector<kj::String>::~Vector(&local_58);
  }
  else {
    sVar2 = Array<kj::String>::size(&this->parts);
    path_00.content.size_ = extraout_RDX_00;
    path_00.content.ptr = pathText_local.content.ptr;
    sVar3 = countParts(this_local,path_00);
    Vector<kj::String>::Vector((Vector<kj::String> *)local_a8,sVar2 + sVar3);
    __end2 = Array<kj::String>::begin(&this->parts);
    pSVar4 = Array<kj::String>::end(&this->parts);
    for (; __end2 != pSVar4; __end2 = __end2 + 1) {
      params = mv<kj::String>(__end2);
      Vector<kj::String>::add<kj::String>((Vector<kj::String> *)local_a8,params);
    }
    this_00 = mv<kj::Vector<kj::String>>((Vector<kj::String> *)local_a8);
    path_02.content.size_ = in_R8;
    path_02.content.ptr = pathText_local.content.ptr;
    evalImpl(__return_storage_ptr__,(Path *)this_00,(Vector<kj::String> *)this_local,path_02);
    Vector<kj::String>::~Vector((Vector<kj::String> *)local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::eval(StringPtr pathText) && {
  if (pathText.startsWith("/")) {
    // Optimization: avoid copying parts that will just be dropped.
    return evalImpl(Vector<String>(countParts(pathText)), pathText);
  } else {
    Vector<String> newParts(parts.size() + countParts(pathText));
    for (auto& p: parts) newParts.add(kj::mv(p));
    return evalImpl(kj::mv(newParts), pathText);
  }
}